

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcOrderAction::~IfcOrderAction(IfcOrderAction *this)

{
  ~IfcOrderAction((IfcOrderAction *)&this[-1].super_IfcTask.field_0x48);
  return;
}

Assistant:

IfcOrderAction() : Object("IfcOrderAction") {}